

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O1

time_t __thiscall Server::Private::time(Private *this,time_t *__timer)

{
  int64 iVar1;
  TimerImpl *pTVar2;
  ICallback *in_RDX;
  TimerImpl *local_28;
  
  iVar1 = Time::ticks();
  pTVar2 = PoolList<Server::Private::TimerImpl>::append<Server::Timer::ICallback&,long,long>
                     (&this->_timers,in_RDX,iVar1 + (long)__timer,(long)__timer);
  local_28 = pTVar2;
  MultiMap<long,_Server::Private::TimerImpl_*>::insert
            (&this->_queuedTimers,&(this->_queuedTimers).root,(Item *)0x0,&pTVar2->executionTime,
             &local_28);
  return (time_t)pTVar2;
}

Assistant:

Server::Timer *Server::Private::time(int64 interval, Timer::ICallback &callback)
{
  TimerImpl &timer = _timers.append<Timer::ICallback&, int64, int64>(callback, Time::ticks() + interval, interval);
  _queuedTimers.insert(timer.executionTime, &timer);
  return (Server::Timer *)&timer;
}